

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O2

uint16_t SharpYuvLinearToGamma(uint32_t v,int bit_depth,SharpYuvTransferFunctionType transfer_type)

{
  double dVar1;
  float fVar2;
  float fVar3;
  double __y;
  
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    v = FixedPointInterpolation(v,kLinearToGammaTabS,7,bit_depth + -0x10);
    goto switchD_001707d5_caseD_8;
  }
  fVar3 = 0.0;
  if (0x11 < transfer_type - kSharpYuvTransferFunctionBt709) goto switchD_001707d5_caseD_2;
  fVar2 = (float)v / 65535.0;
  fVar3 = 0.0;
  switch(transfer_type) {
  default:
    if (0.01805397 <= fVar2) {
      fVar3 = 1.0;
      if (fVar2 < 1.0) goto LAB_0017085f;
    }
    else {
LAB_001707e4:
      fVar3 = fVar2 * 4.5;
    }
    break;
  case 2:
  case 3:
  case kSharpYuvTransferFunctionSrgb:
    break;
  case kSharpYuvTransferFunctionBt470M:
    fVar3 = 1.0;
    if (fVar2 <= 1.0) {
      fVar3 = fVar2;
    }
    dVar1 = (double)fVar3;
    __y = 0.45454543828964233;
    goto LAB_001709c7;
  case kSharpYuvTransferFunctionBt470Bg:
    fVar3 = 1.0;
    if (fVar2 <= 1.0) {
      fVar3 = fVar2;
    }
    dVar1 = (double)fVar3;
    __y = 0.3571428656578064;
    goto LAB_001709c7;
  case kSharpYuvTransferFunctionSmpte240:
    if (fVar2 < 0.022821585) {
      fVar3 = fVar2 * 4.0;
    }
    else {
      fVar3 = 1.0;
      if (fVar2 < 1.0) {
        dVar1 = pow((double)fVar2,0.44999998807907104);
        fVar3 = (float)dVar1 * 1.1115721 + -0.1115722;
      }
    }
    break;
  case kSharpYuvTransferFunctionLinear:
    goto switchD_001707d5_caseD_8;
  case kSharpYuvTransferFunctionLog100:
    fVar3 = 0.0;
    if (0.01 <= fVar2) {
      if (1.0 <= fVar2) {
        fVar2 = 1.0;
      }
      fVar3 = Log10f(fVar2);
      fVar3 = fVar3 * 0.5;
LAB_001709a5:
      fVar3 = fVar3 + 1.0;
    }
    break;
  case kSharpYuvTransferFunctionLog100_Sqrt10:
    fVar3 = 0.0;
    if (0.0031622776 <= fVar2) {
      if (1.0 <= fVar2) {
        fVar2 = 1.0;
      }
      fVar3 = Log10f(fVar2);
      fVar3 = fVar3 / 2.5;
      goto LAB_001709a5;
    }
    break;
  case kSharpYuvTransferFunctionIec61966:
    if (fVar2 < 0.01805397) goto LAB_001707e4;
LAB_0017085f:
    dVar1 = pow((double)fVar2,0.44999998807907104);
    fVar3 = (float)dVar1 * 1.0992968 + -0.09929682;
    break;
  case kSharpYuvTransferFunctionSmpte2084:
    if (0.0 < fVar2) {
      dVar1 = pow((double)fVar2,0.159423828125);
      dVar1 = (double)(((float)dVar1 * 18.851562 + 0.8359375) / ((float)dVar1 * 18.6875 + 1.0));
      __y = 78.84375;
      goto LAB_001709c7;
    }
    break;
  case kSharpYuvTransferFunctionSmpte428:
    if (fVar2 <= 0.0) {
      fVar2 = 0.0;
    }
    dVar1 = (double)(fVar2 * 0.9165553);
    __y = 0.38461539149284363;
LAB_001709c7:
    dVar1 = pow(dVar1,__y);
    fVar3 = (float)dVar1;
    break;
  case kSharpYuvTransferFunctionHlg:
    dVar1 = pow((double)fVar2,0.8333333134651184);
    fVar2 = (float)dVar1;
    fVar3 = 0.0;
    if (0.0 <= fVar2) {
      if (fVar2 <= 0.083333336) {
        fVar2 = fVar2 * 3.0;
        if (fVar2 < 0.0) {
          fVar3 = sqrtf(fVar2);
        }
        else {
          fVar3 = SQRT(fVar2);
        }
      }
      else {
        fVar3 = logf(fVar2 * 12.0 + -0.28466892);
        fVar3 = fVar3 * 0.17883277 + 0.5599107;
      }
    }
  }
switchD_001707d5_caseD_2:
  fVar3 = (float)~(-1 << ((byte)bit_depth & 0x1f)) * fVar3;
  if (0.0 <= fVar3) {
    fVar3 = floorf(fVar3 + 0.5);
  }
  else {
    fVar3 = ceilf(fVar3 + -0.5);
  }
  v = (uint32_t)fVar3;
switchD_001707d5_caseD_8:
  return (uint16_t)v;
}

Assistant:

uint16_t SharpYuvLinearToGamma(uint32_t v, int bit_depth,
                               SharpYuvTransferFunctionType transfer_type) {
  float v_float, linear;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    return FromLinearSrgb(v, bit_depth);
  }
  v_float = (float)v / ((1 << 16) - 1);
  switch (transfer_type) {
    case kSharpYuvTransferFunctionBt709:
    case kSharpYuvTransferFunctionBt601:
    case kSharpYuvTransferFunctionBt2020_10Bit:
    case kSharpYuvTransferFunctionBt2020_12Bit:
      linear = FromLinear709(v_float);
      break;
    case kSharpYuvTransferFunctionBt470M:
      linear = FromLinear470M(v_float);
      break;
    case kSharpYuvTransferFunctionBt470Bg:
      linear = FromLinear470Bg(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte240:
      linear = FromLinearSmpte240(v_float);
      break;
    case kSharpYuvTransferFunctionLinear:
      return v;
    case kSharpYuvTransferFunctionLog100:
      linear = FromLinearLog100(v_float);
      break;
    case kSharpYuvTransferFunctionLog100_Sqrt10:
      linear = FromLinearLog100Sqrt10(v_float);
      break;
    case kSharpYuvTransferFunctionIec61966:
      linear = FromLinearIec61966(v_float);
      break;
    case kSharpYuvTransferFunctionBt1361:
      linear = FromLinearBt1361(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte2084:
      linear = FromLinearPq(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte428:
      linear = FromLinearSmpte428(v_float);
      break;
    case kSharpYuvTransferFunctionHlg:
      linear = FromLinearHlg(v_float);
      break;
    default:
      assert(0);
      linear = 0;
      break;
  }
  return (uint16_t)Roundf(linear * ((1 << bit_depth) - 1));
}